

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_compressed.c
# Opt level: O2

int main(int argc,char **argv)

{
  ALLEGRO_BITMAP *pAVar1;
  char cVar2;
  int iVar3;
  undefined4 uVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  ulong uVar11;
  char *pcVar12;
  char *format;
  char *pcVar13;
  bool bVar14;
  long lVar15;
  double dVar16;
  uint local_164;
  double local_160;
  ulong local_158;
  float local_14c;
  long local_148;
  undefined8 local_140;
  BITMAP_TYPE bitmaps [4];
  ALLEGRO_EVENT event;
  
  memcpy(bitmaps,&DAT_00104bd0,0xc0);
  if (argc < 2) {
    pcVar13 = "data/mysha.pcx";
  }
  else {
    pcVar13 = argv[1];
  }
  cVar2 = al_install_system(0x5020700,atexit);
  if (cVar2 == '\0') {
LAB_00102995:
    pcVar13 = "Could not init Allegro.\n";
  }
  else {
    if (2 < argc) {
      iVar3 = atoi(argv[2]);
      al_set_new_display_adapter(iVar3);
    }
    al_init_image_addon();
    al_init_font_addon();
    al_install_keyboard();
    local_158 = al_create_display(0x280,0x1e0);
    if (local_158 == 0) {
      pcVar13 = "Error creating display\n";
    }
    else {
      for (lVar15 = 0x28; lVar15 != 0xe8; lVar15 = lVar15 + 0x30) {
        uVar4 = *(undefined4 *)((long)bitmaps + lVar15 + -8);
        al_set_new_bitmap_format(uVar4);
        local_160 = (double)al_get_time();
        lVar6 = al_load_bitmap(pcVar13);
        *(long *)((long)&local_160 + lVar15) = lVar6;
        dVar16 = (double)al_get_time();
        if (lVar6 == 0) {
          format = "%s not found or failed to load\n";
          pcVar12 = pcVar13;
LAB_0010298e:
          abort_example(format,pcVar12);
          goto LAB_00102995;
        }
        pcVar12 = *(char **)((long)&bitmaps[0].bmp + lVar15);
        log_printf("%s load time: %f sec\n",dVar16 - local_160,pcVar12);
        local_160 = (double)al_get_time();
        lVar7 = al_clone_bitmap(lVar6);
        *(long *)((long)&local_158 + lVar15) = lVar7;
        dVar16 = (double)al_get_time();
        if (lVar7 == 0) {
LAB_0010296f:
          format = "Couldn\'t clone %s\n";
          goto LAB_0010298e;
        }
        log_printf("%s clone time: %f sec\n",dVar16 - local_160,pcVar12);
        al_set_new_bitmap_format(0);
        local_160 = (double)al_get_time();
        lVar7 = al_clone_bitmap(lVar6);
        *(long *)(&stack0xfffffffffffffeb0 + lVar15) = lVar7;
        dVar16 = (double)al_get_time();
        if (lVar7 == 0) {
          format = "Couldn\'t decompress %s\n";
          goto LAB_0010298e;
        }
        log_printf("%s decompress time: %f sec\n",dVar16 - local_160,pcVar12);
        al_set_new_bitmap_format(uVar4);
        lVar7 = al_clone_bitmap(lVar6);
        *(long *)((long)&local_148 + lVar15) = lVar7;
        if (lVar7 == 0) goto LAB_0010296f;
        iVar3 = al_get_bitmap_width(lVar6);
        if ((0x80 < iVar3) && (iVar3 = al_get_bitmap_height(lVar6), 0x80 < iVar3)) {
          uVar4 = al_get_bitmap_format(lVar6);
          iVar3 = al_get_pixel_block_width(uVar4);
          iVar5 = al_get_pixel_block_height(uVar4);
          al_lock_bitmap_region_blocked
                    (lVar7,0x10 / (long)iVar3 & 0xffffffff,0x10 / (long)iVar5 & 0xffffffff,
                     0x40 / (long)iVar3 & 0xffffffff,0x40 / (long)iVar5 & 0xffffffff,0);
          al_unlock_bitmap(lVar7);
        }
      }
      local_148 = al_load_bitmap("data/bkg.png");
      if (local_148 != 0) {
        local_160 = (double)((ulong)local_160 & 0xffffffff00000000);
        al_set_new_bitmap_format(0);
        local_140 = al_create_builtin_font();
        uVar8 = al_create_timer(0x3fa1111111111111);
        uVar9 = al_create_event_queue();
        uVar10 = al_get_display_event_source(local_158);
        al_register_event_source(uVar9,uVar10);
        uVar10 = al_get_keyboard_event_source();
        al_register_event_source(uVar9,uVar10);
        uVar10 = al_get_timer_event_source(uVar8);
        al_register_event_source(uVar9,uVar10);
        al_start_timer(uVar8);
        bVar14 = true;
        local_164 = 0;
LAB_00102789:
        do {
          al_wait_for_event(uVar9,&event);
          if (event.type == 10) {
            if (event.display.width == 0x4b) {
              local_160 = (double)CONCAT44(local_160._4_4_,1);
            }
            else {
              if (event.display.width == 0x52) {
                local_164 = local_164 - 1;
              }
              else {
                if (event.display.width != 0x53) {
                  if (event.display.width != 0x3b) goto LAB_00102808;
LAB_00102936:
                  al_destroy_bitmap(local_148);
                  for (lVar15 = 0; lVar15 != 0xc0; lVar15 = lVar15 + 0x30) {
                    al_destroy_bitmap(*(undefined8 *)((long)&bitmaps[0].bmp + lVar15));
                  }
                  return 0;
                }
                local_164 = local_164 + 1;
              }
              local_164 = local_164 & 3;
            }
LAB_00102808:
            if (!bVar14) {
              bVar14 = false;
              goto LAB_00102789;
            }
          }
          else {
            if (event.type == 0xc) {
              local_160 = (double)CONCAT44(local_160._4_4_,
                                           CONCAT31((int3)((ulong)local_160 >> 8),
                                                    SUB81(local_160,0) & event.display.width != 0x4b
                                                   ));
              goto LAB_00102808;
            }
            if (event.type != 0x1e) {
              if (event.type != 0x2a) goto LAB_00102808;
              goto LAB_00102936;
            }
          }
          cVar2 = al_is_event_queue_empty(uVar9);
          bVar14 = true;
          if (cVar2 != '\0') {
            pAVar1 = bitmaps[local_164].bmp;
            iVar3 = al_get_bitmap_width(pAVar1);
            iVar5 = al_get_bitmap_height(pAVar1);
            al_map_rgb_f(0,0,0);
            al_clear_to_color();
            bVar14 = false;
            al_draw_bitmap(0,0,local_148,0);
            al_map_rgb_f(0x3f800000,0x3f800000,0x3f800000);
            uVar11 = 0;
            if (((ulong)local_160 & 1) == 0) {
              uVar11 = (ulong)local_164;
            }
            al_draw_textf(local_140,0,"SPACE to compare. Arrows to switch. Format: %s",
                          bitmaps[uVar11].name);
            al_draw_bitmap(0,0x41a00000,bitmaps[uVar11].bmp,0);
            local_158 = CONCAT44(local_158._4_4_,(float)iVar3);
            al_draw_bitmap((float)iVar3,0x41a00000,bitmaps[uVar11].clone,0);
            local_14c = (float)(iVar5 + 0x14);
            al_draw_bitmap(0,bitmaps[uVar11].decomp,0);
            al_draw_bitmap(local_158 & 0xffffffff,bitmaps[uVar11].lock_clone,0);
            al_flip_display();
          }
        } while( true );
      }
      pcVar13 = "data/bkg.png not found or failed to load\n";
      local_148 = 0;
    }
  }
  abort_example(pcVar13);
  iVar3 = __cxa_atexit();
  return iVar3;
}

Assistant:

int main(int argc, char **argv)
{
   const char *filename;
   ALLEGRO_DISPLAY *display;
   ALLEGRO_TIMER *timer;
   ALLEGRO_EVENT_QUEUE *queue;
   ALLEGRO_FONT *font;
   ALLEGRO_BITMAP *bkg;
   bool redraw = true;
   int ii;
   int cur_bitmap = 0;
   bool compare = false;
   #define NUM_BITMAPS 4
   BITMAP_TYPE bitmaps[NUM_BITMAPS] = {
      {NULL, NULL, NULL, NULL, ALLEGRO_PIXEL_FORMAT_ANY,       "Uncompressed"},
      {NULL, NULL, NULL, NULL, ALLEGRO_PIXEL_FORMAT_COMPRESSED_RGBA_DXT1, "DXT1"},
      {NULL, NULL, NULL, NULL, ALLEGRO_PIXEL_FORMAT_COMPRESSED_RGBA_DXT3, "DXT3"},
      {NULL, NULL, NULL, NULL, ALLEGRO_PIXEL_FORMAT_COMPRESSED_RGBA_DXT5, "DXT5"},
   };

   if (argc > 1) {
      filename = argv[1];
   }
   else {
      filename = "data/mysha.pcx";
   }

   if (!al_init()) {
      abort_example("Could not init Allegro.\n");
   }

   open_log();

   if (argc > 2) {
      al_set_new_display_adapter(atoi(argv[2]));
   }

   al_init_image_addon();
   al_init_font_addon();
   al_install_keyboard();

   display = al_create_display(640, 480);
   if (!display) {
      abort_example("Error creating display\n");
   }

   for (ii = 0; ii < NUM_BITMAPS; ii++) {
      double t0, t1;
      al_set_new_bitmap_format(bitmaps[ii].format);

      /* Load */
      t0 = al_get_time();
      bitmaps[ii].bmp = al_load_bitmap(filename);
      t1 = al_get_time();

      if (!bitmaps[ii].bmp) {
         abort_example("%s not found or failed to load\n", filename);
      }
      log_printf("%s load time: %f sec\n", bitmaps[ii].name, t1 - t0);

      /* Clone */
      t0 = al_get_time();
      bitmaps[ii].clone = al_clone_bitmap(bitmaps[ii].bmp);
      t1 = al_get_time();

      if (!bitmaps[ii].clone) {
         abort_example("Couldn't clone %s\n", bitmaps[ii].name);
      }
      log_printf("%s clone time: %f sec\n", bitmaps[ii].name, t1 - t0);

      /* Decompress */
      al_set_new_bitmap_format(ALLEGRO_PIXEL_FORMAT_ANY);
      t0 = al_get_time();
      bitmaps[ii].decomp = al_clone_bitmap(bitmaps[ii].bmp);
      t1 = al_get_time();

      if (!bitmaps[ii].decomp) {
         abort_example("Couldn't decompress %s\n", bitmaps[ii].name);
      }
      log_printf("%s decompress time: %f sec\n", bitmaps[ii].name, t1 - t0);

      /* RW lock */
      al_set_new_bitmap_format(bitmaps[ii].format);
      bitmaps[ii].lock_clone = al_clone_bitmap(bitmaps[ii].bmp);

      if (!bitmaps[ii].lock_clone) {
         abort_example("Couldn't clone %s\n", bitmaps[ii].name);
      }

      if (al_get_bitmap_width(bitmaps[ii].bmp) > 128
            && al_get_bitmap_height(bitmaps[ii].bmp) > 128) {
         int bitmap_format = al_get_bitmap_format(bitmaps[ii].bmp);
         int block_width = al_get_pixel_block_width(bitmap_format);
         int block_height = al_get_pixel_block_height(bitmap_format);

         /* Lock and unlock it, hopefully causing a no-op operation */
         al_lock_bitmap_region_blocked(bitmaps[ii].lock_clone,
            16 / block_width, 16 / block_height, 64 / block_width,
            64 / block_height, ALLEGRO_LOCK_READWRITE);

         al_unlock_bitmap(bitmaps[ii].lock_clone);
      }
   }

   bkg = al_load_bitmap("data/bkg.png");
   if (!bkg) {
      abort_example("data/bkg.png not found or failed to load\n");
   }

   al_set_new_bitmap_format(ALLEGRO_PIXEL_FORMAT_ANY);
   font = al_create_builtin_font();
   timer = al_create_timer(1.0 / 30);
   queue = al_create_event_queue();
   al_register_event_source(queue, al_get_display_event_source(display));
   al_register_event_source(queue, al_get_keyboard_event_source());
   al_register_event_source(queue, al_get_timer_event_source(timer));
   al_start_timer(timer);

   while (1) {
      ALLEGRO_EVENT event;
      al_wait_for_event(queue, &event);
      switch (event.type) {
         case ALLEGRO_EVENT_DISPLAY_CLOSE:
            goto EXIT;
         case ALLEGRO_EVENT_TIMER:
            redraw = true;
            break;
         case ALLEGRO_EVENT_KEY_DOWN:
            switch (event.keyboard.keycode) {
               case ALLEGRO_KEY_LEFT:
                  cur_bitmap = (cur_bitmap - 1 + NUM_BITMAPS) % NUM_BITMAPS;
                  break;
               case ALLEGRO_KEY_RIGHT:
                  cur_bitmap = (cur_bitmap + 1) % NUM_BITMAPS;
                  break;
               case ALLEGRO_KEY_SPACE:
                  compare = true;
                  break;
               case ALLEGRO_KEY_ESCAPE:
                  goto EXIT;
            }
            break;
         case ALLEGRO_EVENT_KEY_UP:
            if (event.keyboard.keycode == ALLEGRO_KEY_SPACE) {
               compare = false;
            }
            break;
      }
      if (redraw && al_is_event_queue_empty(queue)) {
         int w = al_get_bitmap_width(bitmaps[cur_bitmap].bmp);
         int h = al_get_bitmap_height(bitmaps[cur_bitmap].bmp);
         int idx = compare ? 0 : cur_bitmap;
         redraw = false;
         al_clear_to_color(al_map_rgb_f(0, 0, 0));
         al_draw_bitmap(bkg, 0, 0, 0);
         al_draw_textf(font, al_map_rgb_f(1, 1, 1), 5, 5, ALLEGRO_ALIGN_LEFT,
            "SPACE to compare. Arrows to switch. Format: %s", bitmaps[idx].name);
         al_draw_bitmap(bitmaps[idx].bmp, 0, 20, 0);
         al_draw_bitmap(bitmaps[idx].clone, w, 20, 0);
         al_draw_bitmap(bitmaps[idx].decomp, 0, 20 + h, 0);
         al_draw_bitmap(bitmaps[idx].lock_clone, w, 20 + h, 0);
         al_flip_display();
      }
   }
EXIT:

   al_destroy_bitmap(bkg);
   for (ii = 0; ii < NUM_BITMAPS; ii++) {
      al_destroy_bitmap(bitmaps[ii].bmp);
   }

   close_log(false);

   return 0;
}